

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ProductionSyntax::setChild(ProductionSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0025c228 + *(int *)(&DAT_0025c228 + index * 4)))();
  return;
}

Assistant:

void ProductionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: dataType = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 1: name = child.token(); return;
        case 2: portList = child.node() ? &child.node()->as<FunctionPortListSyntax>() : nullptr; return;
        case 3: colon = child.token(); return;
        case 4: rules = child.node()->as<SeparatedSyntaxList<RsRuleSyntax>>(); return;
        case 5: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}